

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Tbc::Text::Text(Text *this,string *_str,TextAttributes *_attr)

{
  ulong uVar1;
  size_t sVar2;
  bool bVar3;
  bool bVar4;
  size_type sVar5;
  long lVar6;
  unsigned_long *puVar7;
  reference pcVar8;
  long lVar9;
  allocator local_231;
  string local_230 [39];
  allocator<char> local_209;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_208;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_178;
  iterator findIt;
  bool foundWrapPoint;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_158;
  iterator itNewLine;
  iterator itNext;
  iterator itEnd;
  unsigned_long local_138;
  unsigned_long local_130;
  size_t width;
  string suffix;
  value_type local_100;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  iterator strEnd;
  iterator it;
  undefined1 local_c8 [8];
  string indent;
  string local_a0 [8];
  string wrappableInsteadOfChars;
  string local_78 [8];
  string wrappableAfterChars;
  allocator local_41;
  string local_40 [8];
  string wrappableBeforeChars;
  TextAttributes *_attr_local;
  string *_str_local;
  Text *this_local;
  
  wrappableBeforeChars.field_2._8_8_ = _attr;
  std::__cxx11::string::string((string *)this);
  (this->attr).width = *(size_t *)(wrappableBeforeChars.field_2._8_8_ + 0x10);
  sVar2 = *(size_t *)(wrappableBeforeChars.field_2._8_8_ + 8);
  (this->attr).initialIndent = *(size_t *)wrappableBeforeChars.field_2._8_8_;
  (this->attr).indent = sVar2;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->lines);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"[({<\t",&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_78,"])}>-,./|\\",
             (allocator *)(wrappableInsteadOfChars.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator
            ((allocator<char> *)(wrappableInsteadOfChars.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0," \n\r",(allocator *)(indent.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(indent.field_2._M_local_buf + 0xf));
  it._M_current._6_1_ = 0;
  it._M_current._4_1_ = 0;
  if (*(long *)wrappableBeforeChars.field_2._8_8_ == -1) {
    uVar1 = *(ulong *)(wrappableBeforeChars.field_2._8_8_ + 8);
    std::allocator<char>::allocator();
    it._M_current._4_1_ = 1;
    std::__cxx11::string::string
              ((string *)local_c8,uVar1,' ',(allocator *)((long)&it._M_current + 5));
  }
  else {
    uVar1 = *(ulong *)wrappableBeforeChars.field_2._8_8_;
    std::allocator<char>::allocator();
    it._M_current._6_1_ = 1;
    std::__cxx11::string::string
              ((string *)local_c8,uVar1,' ',(allocator *)((long)&it._M_current + 7));
  }
  if ((it._M_current._4_1_ & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_current + 5));
  }
  if ((it._M_current._6_1_ & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_current + 7));
  }
  strEnd._M_current = (char *)std::__cxx11::string::begin();
  local_e0._M_current = (char *)std::__cxx11::string::end();
  do {
    bVar3 = __gnu_cxx::operator!=(&strEnd,&local_e0);
    if (!bVar3) {
      suffix.field_2._8_4_ = 0;
LAB_00153d17:
      std::__cxx11::string::~string((string *)local_c8);
      std::__cxx11::string::~string(local_a0);
      std::__cxx11::string::~string(local_78);
      std::__cxx11::string::~string(local_40);
      return;
    }
    sVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->lines);
    if (999 < sVar5) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_100,"... message truncated due to excessive size",
                 (allocator *)(suffix.field_2._M_local_buf + 0xf));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->lines,&local_100);
      std::__cxx11::string::~string((string *)&local_100);
      std::allocator<char>::~allocator((allocator<char> *)(suffix.field_2._M_local_buf + 0xf));
      suffix.field_2._8_4_ = 1;
      goto LAB_00153d17;
    }
    std::__cxx11::string::string((string *)&width);
    local_138 = __gnu_cxx::operator-(&local_e0,&strEnd);
    lVar9 = *(long *)(wrappableBeforeChars.field_2._8_8_ + 0x10);
    lVar6 = std::__cxx11::string::size();
    itEnd._M_current = (char *)(lVar9 - lVar6);
    puVar7 = std::min<unsigned_long>(&local_138,(unsigned_long *)&itEnd);
    local_130 = *puVar7;
    itNext._M_current =
         (char *)__gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator+(&strEnd,local_130);
    itNewLine._M_current = (char *)std::__cxx11::string::end();
    findIt._M_current._7_1_ = 10;
    local_158 = std::find<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char>
                          (strEnd._M_current,itNext._M_current,
                           (char *)((long)&findIt._M_current + 7));
    bVar3 = __gnu_cxx::operator!=(&local_158,&itNext);
    if (bVar3) {
      itNext._M_current = local_158._M_current;
    }
    bVar3 = __gnu_cxx::operator!=(&itNext,&local_e0);
    if (bVar3) {
      findIt._M_current._6_1_ = 0;
      local_178._M_current = itNext._M_current;
      do {
        pcVar8 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_178);
        lVar9 = std::__cxx11::string::find((char)local_78,(ulong)(uint)(int)*pcVar8);
        if ((lVar9 == -1) || (bVar3 = __gnu_cxx::operator!=(&local_178,&itNext), !bVar3)) {
          bVar3 = __gnu_cxx::operator>(&local_178,&strEnd);
          if (bVar3) {
            pcVar8 = __gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&local_178);
            lVar9 = std::__cxx11::string::find((char)local_40,(ulong)(uint)(int)*pcVar8);
            if (lVar9 != -1) {
              itNext._M_current = local_178._M_current;
              itNewLine._M_current = local_178._M_current;
              findIt._M_current._6_1_ = 1;
              goto LAB_001539ef;
            }
          }
          pcVar8 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_178);
          lVar9 = std::__cxx11::string::find((char)local_a0,(ulong)(uint)(int)*pcVar8);
          if (lVar9 != -1) {
            local_190 = (char *)__gnu_cxx::
                                __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator+(&local_178,1);
            itNext._M_current = local_178._M_current;
            findIt._M_current._6_1_ = 1;
            itNewLine._M_current = local_190;
          }
        }
        else {
          local_180 = (char *)__gnu_cxx::
                              __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::operator+(&local_178,1);
          itNext._M_current = local_180;
          local_188 = (char *)__gnu_cxx::
                              __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::operator+(&local_178,1);
          findIt._M_current._6_1_ = 1;
          itNewLine._M_current = local_188;
        }
LAB_001539ef:
        bVar3 = __gnu_cxx::operator==(&local_178,&strEnd);
      } while ((!bVar3) &&
              (__gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator--(&local_178), ((findIt._M_current._6_1_ ^ 0xff) & 1) != 0));
      if ((findIt._M_current._6_1_ & 1) == 0) {
        __gnu_cxx::
        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator--(&itNext);
        itNewLine = itNext;
        std::__cxx11::string::operator=((string *)&width,"-");
      }
      else {
        while( true ) {
          bVar4 = __gnu_cxx::operator>(&itNext,&strEnd);
          bVar3 = false;
          if (bVar4) {
            local_198 = __gnu_cxx::
                        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator-(&itNext,1);
            pcVar8 = __gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&local_198);
            lVar9 = std::__cxx11::string::find((char)local_a0,(ulong)(uint)(int)*pcVar8);
            bVar3 = lVar9 != -1;
          }
          if (!bVar3) break;
          __gnu_cxx::
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator--(&itNext);
        }
      }
    }
    local_200._M_current = strEnd._M_current;
    local_208._M_current = itNext._M_current;
    std::allocator<char>::allocator();
    std::__cxx11::string::
    string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
              ((string *)&local_1f8,local_200,local_208,&local_209);
    std::operator+(&local_1d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,
                   &local_1f8);
    std::operator+(&local_1b8,&local_1d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&width);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->lines,&local_1b8);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::allocator<char>::~allocator(&local_209);
    lVar9 = std::__cxx11::string::size();
    if (lVar9 != *(long *)(wrappableBeforeChars.field_2._8_8_ + 8)) {
      uVar1 = *(ulong *)(wrappableBeforeChars.field_2._8_8_ + 8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_230,uVar1,' ',&local_231);
      std::__cxx11::string::operator=((string *)local_c8,local_230);
      std::__cxx11::string::~string(local_230);
      std::allocator<char>::~allocator((allocator<char> *)&local_231);
    }
    strEnd = itNewLine;
    std::__cxx11::string::~string((string *)&width);
  } while( true );
}

Assistant:

Text( std::string const& _str, TextAttributes const& _attr = TextAttributes() )
        : attr( _attr )
        {
            const std::string wrappableBeforeChars = "[({<\t";
            const std::string wrappableAfterChars = "])}>-,./|\\";
            const std::string wrappableInsteadOfChars = " \n\r";
            std::string indent = _attr.initialIndent != std::string::npos
                ? std::string( _attr.initialIndent, ' ' )
                : std::string( _attr.indent, ' ' );

            typedef std::string::const_iterator iterator;
            iterator it = _str.begin();
            const iterator strEnd = _str.end();

            while( it != strEnd ) {

                if( lines.size() >= 1000 ) {
                    lines.push_back( "... message truncated due to excessive size" );
                    return;
                }

                std::string suffix;
                std::size_t width = (std::min)( static_cast<size_t>( strEnd-it ), _attr.width-static_cast<size_t>( indent.size() ) );
                iterator itEnd = it+width;
                iterator itNext = _str.end();

                iterator itNewLine = std::find( it, itEnd, '\n' );
                if( itNewLine != itEnd )
                    itEnd = itNewLine;

                if( itEnd != strEnd  ) {
                    bool foundWrapPoint = false;
                    iterator findIt = itEnd;
                    do {
                        if( wrappableAfterChars.find( *findIt ) != std::string::npos && findIt != itEnd ) {
                            itEnd = findIt+1;
                            itNext = findIt+1;
                            foundWrapPoint = true;
                        }
                        else if( findIt > it && wrappableBeforeChars.find( *findIt ) != std::string::npos ) {
                            itEnd = findIt;
                            itNext = findIt;
                            foundWrapPoint = true;
                        }
                        else if( wrappableInsteadOfChars.find( *findIt ) != std::string::npos ) {
                            itNext = findIt+1;
                            itEnd = findIt;
                            foundWrapPoint = true;
                        }
                        if( findIt == it )
                            break;
                        else
                            --findIt;
                    }
                    while( !foundWrapPoint );

                    if( !foundWrapPoint ) {
                        // No good wrap char, so we'll break mid word and add a hyphen
                        --itEnd;
                        itNext = itEnd;
                        suffix = "-";
                    }
                    else {
                        while( itEnd > it && wrappableInsteadOfChars.find( *(itEnd-1) ) != std::string::npos )
                            --itEnd;
                    }
                }
                lines.push_back( indent + std::string( it, itEnd ) + suffix );

                if( indent.size() != _attr.indent )
                    indent = std::string( _attr.indent, ' ' );
                it = itNext;
            }
        }